

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_> __thiscall
Assimp::FIReader::create(FIReader *this,IOStream *stream)

{
  CFIReaderImpl *this_00;
  MemoryIOStream *this_01;
  pointer buff;
  CIrrXML_IOStreamReader *this_02;
  pointer _stream;
  CXMLReaderImpl *this_03;
  pointer callback_00;
  IrrXMLReader *__p;
  unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
  local_68;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  local_60;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  callback;
  unique_ptr<Assimp::MemoryIOStream,_std::default_delete<Assimp::MemoryIOStream>_> memios;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_48 [3];
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_30;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> data;
  size_t sStack_20;
  bool isFI;
  size_t size;
  IOStream *stream_local;
  
  size = (size_t)stream;
  stream_local = (IOStream *)this;
  readFile((Assimp *)&local_30,stream,&stack0xffffffffffffffe0,
           (bool *)((long)&data._M_t.
                           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                           .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 7));
  if ((data._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._7_1_ & 1) == 0) {
    this_01 = (MemoryIOStream *)
              Intern::AllocateFromAssimpHeap::operator_new
                        ((AllocateFromAssimpHeap *)0x28,(size_t)stream);
    buff = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::release
                     (&local_30);
    MemoryIOStream::MemoryIOStream(this_01,buff,sStack_20,true);
    std::unique_ptr<Assimp::MemoryIOStream,std::default_delete<Assimp::MemoryIOStream>>::
    unique_ptr<std::default_delete<Assimp::MemoryIOStream>,void>
              ((unique_ptr<Assimp::MemoryIOStream,std::default_delete<Assimp::MemoryIOStream>> *)
               &callback,this_01);
    this_02 = (CIrrXML_IOStreamReader *)operator_new(0x30);
    _stream = std::unique_ptr<Assimp::MemoryIOStream,_std::default_delete<Assimp::MemoryIOStream>_>
              ::get((unique_ptr<Assimp::MemoryIOStream,_std::default_delete<Assimp::MemoryIOStream>_>
                     *)&callback);
    CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_02,&_stream->super_IOStream);
    std::
    unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>::
    unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
              ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
                *)&local_60,this_02);
    this_03 = (CXMLReaderImpl *)operator_new(0x10);
    callback_00 = std::
                  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                  ::get(&local_60);
    __p = irr::io::createIrrXMLReader(&callback_00->super_IFileReadCallBack);
    std::
    unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
    ::unique_ptr<std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>,void>
              ((unique_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,std::default_delete<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>>
                *)&local_68,__p);
    CXMLReaderImpl::CXMLReaderImpl(this_03,&local_68);
    std::unique_ptr<Assimp::FIReader,std::default_delete<Assimp::FIReader>>::
    unique_ptr<std::default_delete<Assimp::FIReader>,void>
              ((unique_ptr<Assimp::FIReader,std::default_delete<Assimp::FIReader>> *)this,
               (pointer)this_03);
    std::
    unique_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_std::default_delete<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>_>
    ::~unique_ptr(&local_68);
    std::
    unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
    ::~unique_ptr(&local_60);
    std::unique_ptr<Assimp::MemoryIOStream,_std::default_delete<Assimp::MemoryIOStream>_>::
    ~unique_ptr((unique_ptr<Assimp::MemoryIOStream,_std::default_delete<Assimp::MemoryIOStream>_> *)
                &callback);
  }
  else {
    this_00 = (CFIReaderImpl *)operator_new(0x230);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::unique_ptr
              (local_48,&local_30);
    CFIReaderImpl::CFIReaderImpl(this_00,local_48,sStack_20);
    std::unique_ptr<Assimp::FIReader,std::default_delete<Assimp::FIReader>>::
    unique_ptr<std::default_delete<Assimp::FIReader>,void>
              ((unique_ptr<Assimp::FIReader,std::default_delete<Assimp::FIReader>> *)this,
               (pointer)this_00);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(local_48);
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_30);
  return (__uniq_ptr_data<Assimp::FIReader,_std::default_delete<Assimp::FIReader>,_true,_true>)
         (__uniq_ptr_data<Assimp::FIReader,_std::default_delete<Assimp::FIReader>,_true,_true>)this;
}

Assistant:

std::unique_ptr<FIReader> FIReader::create(IOStream *stream)
{
    size_t size;
    bool isFI;
    auto data = readFile(stream, size, isFI);
    if (isFI) {
        return std::unique_ptr<FIReader>(new CFIReaderImpl(std::move(data), size));
    }
    else {
        auto memios = std::unique_ptr<MemoryIOStream>(new MemoryIOStream(data.release(), size, true));
        auto callback = std::unique_ptr<CIrrXML_IOStreamReader>(new CIrrXML_IOStreamReader(memios.get()));
        return std::unique_ptr<FIReader>(new CXMLReaderImpl(std::unique_ptr<irr::io::IIrrXMLReader<char, irr::io::IXMLBase>>(createIrrXMLReader(callback.get()))));
    }
}